

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopOper.c
# Opt level: O0

Hop_Obj_t * Hop_Exor(Hop_Man_t *p,Hop_Obj_t *p0,Hop_Obj_t *p1)

{
  Hop_Obj_t *pHVar1;
  Hop_Obj_t *pHVar2;
  Hop_Obj_t *p1_local;
  Hop_Obj_t *p0_local;
  Hop_Man_t *p_local;
  
  pHVar1 = Hop_Not(p1);
  pHVar1 = Hop_And(p,p0,pHVar1);
  pHVar2 = Hop_Not(p0);
  pHVar2 = Hop_And(p,pHVar2,p1);
  pHVar1 = Hop_Or(p,pHVar1,pHVar2);
  return pHVar1;
}

Assistant:

Hop_Obj_t * Hop_Exor( Hop_Man_t * p, Hop_Obj_t * p0, Hop_Obj_t * p1 )
{
/*
    Hop_Obj_t * pGhost, * pResult;
    // check trivial cases
    if ( p0 == p1 )
        return Hop_Not(p->pConst1);
    if ( p0 == Hop_Not(p1) )
        return p->pConst1;
    if ( Hop_Regular(p0) == p->pConst1 )
        return Hop_NotCond( p1, p0 == p->pConst1 );
    if ( Hop_Regular(p1) == p->pConst1 )
        return Hop_NotCond( p0, p1 == p->pConst1 );
    // check the table
    pGhost = Hop_ObjCreateGhost( p, p0, p1, AIG_EXOR );
    if ( pResult = Hop_TableLookup( p, pGhost ) )
        return pResult;
    return Hop_ObjCreate( p, pGhost );
*/
    return Hop_Or( p, Hop_And(p, p0, Hop_Not(p1)), Hop_And(p, Hop_Not(p0), p1) );
}